

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

void __thiscall
LowererMD::GenerateIsJsObjectTest
          (LowererMD *this,RegOpnd *instanceReg,Instr *insertInstr,LabelInstr *labelHelper)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  uint32 offset;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar5;
  Instr *pIVar6;
  undefined4 *puVar7;
  IntConstOpnd *this_00;
  BranchInstr *instr;
  
  GenerateObjectTest(this,&instanceReg->super_Opnd,insertInstr,labelHelper,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar5 = IR::IndirOpnd::New(instanceReg,8,TyInt64,this->m_func,false);
  pIVar6 = IR::Instr::New(MOV,&baseOpnd->super_Opnd,&pIVar5->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar6);
  pIVar6 = IR::Instr::New(CMP,this->m_func);
  offset = Js::Type::GetOffsetOfTypeId();
  pIVar5 = IR::IndirOpnd::New(baseOpnd,offset,TyInt32,this->m_func,false);
  if (pIVar6->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0066132d;
    *puVar7 = 0;
  }
  pFVar1 = pIVar6->m_func;
  if ((pIVar5->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0066132d;
    *puVar7 = 0;
  }
  bVar4 = (pIVar5->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    pIVar5 = (IndirOpnd *)IR::Opnd::Copy(&pIVar5->super_Opnd,pFVar1);
    bVar4 = (pIVar5->super_Opnd).field_0xb;
  }
  (pIVar5->super_Opnd).field_0xb = bVar4 | 2;
  pIVar6->m_src1 = &pIVar5->super_Opnd;
  this_00 = IR::IntConstOpnd::New(0x16,TyInt32,this->m_func,false);
  if (pIVar6->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0066132d;
    *puVar7 = 0;
  }
  pFVar1 = pIVar6->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_0066132d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  pIVar6->m_src2 = &this_00->super_Opnd;
  IR::Instr::InsertBefore(insertInstr,pIVar6);
  instr = IR::BranchInstr::New(JLE,labelHelper,this->m_func);
  IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
  return;
}

Assistant:

void LowererMD::GenerateIsJsObjectTest(IR::RegOpnd* instanceReg, IR::Instr* insertInstr, IR::LabelInstr* labelHelper)
{
    // TEST instanceReg, (Js::AtomTag_IntPtr | Js::FloatTag_Value )
    GenerateObjectTest(instanceReg, insertInstr, labelHelper);

    IR::RegOpnd * typeReg = IR::RegOpnd::New(TyMachReg, this->m_func);

    // MOV typeReg, instanceReg + offsetof(RecyclableObject::type)
    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, typeReg,
        IR::IndirOpnd::New(instanceReg, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func),
        m_func));

    // CMP [typeReg + offsetof(Type::typeid)], TypeIds_LastJavascriptPrimitiveType
    IR::Instr * cmp = IR::Instr::New(Js::OpCode::CMP, this->m_func);
    cmp->SetSrc1(IR::IndirOpnd::New(typeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func));
    cmp->SetSrc2(IR::IntConstOpnd::New(Js::TypeId::TypeIds_LastJavascriptPrimitiveType, TyInt32, this->m_func));
    insertInstr->InsertBefore(cmp);

    // JLE labelHelper
    insertInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::JLE, labelHelper, this->m_func));
}